

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

void __thiscall
re2::NFA::AddToThreadq(NFA *this,Threadq *q,int id0,int c,int flag,char *p,Thread *t0)

{
  Inst *this_00;
  uint uVar1;
  AddState *pAVar2;
  Inst *pIVar3;
  bool bVar4;
  int iVar5;
  EmptyOp EVar6;
  iterator iVar7;
  long lVar8;
  Thread *pTVar9;
  ostream *poVar10;
  int iVar11;
  uint i;
  uint uVar12;
  long lVar13;
  ulong local_200;
  Thread *local_1e8;
  long local_1d0;
  LogMessageFatal local_1b0;
  
  if (id0 != 0) {
    local_1e8 = t0;
    pAVar2 = this->astack_;
    pAVar2->id = id0;
    pAVar2->t = (Thread *)0x0;
    local_200 = 1;
LAB_001311af:
    iVar5 = (int)local_200;
    if (0 < iVar5) {
      if (this->nastack_ < iVar5) {
        __assert_fail("(nstk) <= (nastack_)",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                      0xd8,
                      "void re2::NFA::AddToThreadq(Threadq *, int, int, int, const char *, Thread *)"
                     );
      }
      local_200 = (ulong)(iVar5 - 1);
      uVar12 = pAVar2[local_200].id;
      pTVar9 = pAVar2[local_200].t;
LAB_001311e8:
      local_1d0 = (long)(int)uVar12 * 8;
      lVar13 = 0;
      i = uVar12;
      do {
        if (pTVar9 != (Thread *)0x0) {
          Decref(this,local_1e8);
          local_1e8 = pTVar9;
        }
        if (((int)uVar12 == lVar13) ||
           (bVar4 = SparseArray<re2::NFA::Thread_*>::has_index(q,i), bVar4)) goto LAB_001311af;
        SparseArray<re2::NFA::Thread_*>::set_new(q,i,(Thread *)0x0);
        iVar7 = SparseArray<re2::NFA::Thread_*>::find(q,i);
        pIVar3 = this->prog_->inst_;
        this_00 = (Inst *)((long)&pIVar3->out_opcode_ + local_1d0);
        uVar1 = *(uint *)((long)&pIVar3->out_opcode_ + local_1d0);
        lVar8 = (long)(int)local_200;
        iVar5 = (int)lVar13;
        switch(uVar1 & 7) {
        case 0:
          LogMessageFatal::LogMessageFatal
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                     0xf7);
          poVar10 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"unhandled ");
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              (poVar10,*(uint *)((long)&pIVar3->out_opcode_ + local_1d0) & 7);
          std::operator<<(poVar10," in AddToThreadq");
          LogMessageFatal::~LogMessageFatal(&local_1b0);
        case 7:
switchD_00131281_caseD_7:
          goto LAB_001311af;
        case 1:
          pTVar9 = Incref(this,local_1e8);
          (iVar7._M_current)->second = pTVar9;
          if ((this_00->out_opcode_ & 8) != 0) {
            __assert_fail("!ip->last()",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                          ,0x102,
                          "void re2::NFA::AddToThreadq(Threadq *, int, int, int, const char *, Thread *)"
                         );
          }
          goto LAB_001312d4;
        case 2:
          bVar4 = Prog::Inst::Matches(this_00,c);
          if (bVar4) goto switchD_00131281_caseD_5;
          goto LAB_001312c5;
        case 3:
          goto switchD_00131281_caseD_3;
        case 4:
          if ((uVar1 & 8) == 0) {
            local_200 = (ulong)((int)local_200 + 1);
            pAVar2[lVar8].id = (uVar12 - iVar5) + 1;
            pAVar2[lVar8].t = (Thread *)0x0;
          }
          EVar6 = Prog::Inst::empty(this_00);
          if ((~flag & EVar6) != 0) goto LAB_001311af;
          goto LAB_001313f1;
        case 5:
switchD_00131281_caseD_5:
          pTVar9 = Incref(this,local_1e8);
          (iVar7._M_current)->second = pTVar9;
LAB_001312c5:
          if ((this_00->out_opcode_ & 8) != 0) goto switchD_00131281_caseD_7;
LAB_001312d4:
          lVar13 = lVar13 + -1;
          local_1d0 = local_1d0 + 8;
          i = i + 1;
          pTVar9 = (Thread *)0x0;
          break;
        case 6:
          if ((uVar1 & 8) == 0) {
            local_200 = (ulong)((int)local_200 + 1);
            pAVar2[lVar8].id = (uVar12 - iVar5) + 1;
            pAVar2[lVar8].t = (Thread *)0x0;
          }
          goto LAB_001313f1;
        }
      } while( true );
    }
  }
  return;
switchD_00131281_caseD_3:
  if ((uVar1 & 8) == 0) {
    local_200 = (ulong)((int)local_200 + 1);
    pAVar2[lVar8].id = (uVar12 - iVar5) + 1;
    pAVar2[lVar8].t = (Thread *)0x0;
  }
  iVar5 = Prog::Inst::cap(this_00);
  if (iVar5 < this->ncapture_) {
    iVar11 = (int)local_200;
    local_200 = (ulong)(iVar11 + 1);
    pAVar2[iVar11].id = 0;
    pAVar2[iVar11].t = local_1e8;
    pTVar9 = AllocThread(this);
    CopyCapture(this,pTVar9->capture,local_1e8->capture);
    pTVar9->capture[iVar5] = p;
    local_1e8 = pTVar9;
  }
LAB_001313f1:
  uVar12 = *(uint *)((long)&pIVar3->out_opcode_ + local_1d0) >> 4;
  pTVar9 = (Thread *)0x0;
  goto LAB_001311e8;
}

Assistant:

void NFA::AddToThreadq(Threadq* q, int id0, int c, int flag,
                       const char* p, Thread* t0) {
  if (id0 == 0)
    return;

  // Use astack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   two entries per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  AddState* stk = astack_;
  int nstk = 0;

  stk[nstk++] = AddState(id0);
  while (nstk > 0) {
    DCHECK_LE(nstk, nastack_);
    AddState a = stk[--nstk];

  Loop:
    if (a.t != NULL) {
      // t0 was a thread that we allocated and copied in order to
      // record the capture, so we must now decref it.
      Decref(t0);
      t0 = a.t;
    }

    int id = a.id;
    if (id == 0)
      continue;
    if (q->has_index(id)) {
      if (Debug)
        fprintf(stderr, "  [%d%s]\n", id, FormatCapture(t0->capture).c_str());
      continue;
    }

    // Create entry in q no matter what.  We might fill it in below,
    // or we might not.  Even if not, it is necessary to have it,
    // so that we don't revisit id0 during the recursion.
    q->set_new(id, NULL);

    Thread** tp = &q->find(id)->second;
    int j;
    Thread* t;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
    default:
      LOG(DFATAL) << "unhandled " << ip->opcode() << " in AddToThreadq";
      break;

    case kInstFail:
      break;

    case kInstAltMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

      DCHECK(!ip->last());
      a = AddState(id+1);
      goto Loop;

    case kInstNop:
      if (!ip->last())
        stk[nstk++] = AddState(id+1);

      // Continue on.
      a = AddState(ip->out());
      goto Loop;

    case kInstCapture:
      if (!ip->last())
        stk[nstk++] = AddState(id+1);

      if ((j=ip->cap()) < ncapture_) {
        // Push a dummy whose only job is to restore t0
        // once we finish exploring this possibility.
        stk[nstk++] = AddState(0, t0);

        // Record capture.
        t = AllocThread();
        CopyCapture(t->capture, t0->capture);
        t->capture[j] = p;
        t0 = t;
      }
      a = AddState(ip->out());
      goto Loop;

    case kInstByteRange:
      if (!ip->Matches(c))
        goto Next;
      // Fallthrough intended.

    case kInstMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;
      if (Debug)
        fprintf(stderr, " + %d%s\n", id, FormatCapture(t0->capture).c_str());

    Next:
      if (ip->last())
        break;
      a = AddState(id+1);
      goto Loop;

    case kInstEmptyWidth:
      if (!ip->last())
        stk[nstk++] = AddState(id+1);

      // Continue on if we have all the right flag bits.
      if (ip->empty() & ~flag)
        break;
      a = AddState(ip->out());
      goto Loop;
    }
  }
}